

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedPumpTo::write
          (BlockedPumpTo *this,int __fd,void *__buf,size_t __n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  _func_int **pp_Var3;
  PromiseNode *pPVar4;
  Own<kj::_::ChainPromiseNode> OVar5;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::Canceler::AdapterImpl<void>_>_> OVar6;
  Fault f;
  Own<kj::_::PromiseNode> local_70;
  Promise<void> local_60;
  Own<kj::_::PromiseNode> local_50;
  Fault local_40;
  undefined8 uStack_38;
  
  pp_Var3 = (_func_int **)CONCAT44(in_register_00000034,__fd);
  if (pp_Var3[7] == (_func_int *)0x0) {
    pPVar4 = (PromiseNode *)(pp_Var3[5] + -(long)pp_Var3[6]);
    if (__n <= (PromiseNode *)(pp_Var3[5] + -(long)pp_Var3[6])) {
      pPVar4 = (PromiseNode *)__n;
    }
    (*(code *)**(undefined8 **)pp_Var3[4])(&local_70,pp_Var3[4],__buf,pPVar4);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_70,
               _::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:810:17),_kj::_::PropagateException>
               ::anon_class_32_4_aebd93b5_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00467498;
    this_00[1].super_PromiseNode._vptr_PromiseNode = pp_Var3;
    this_00[1].dependency.disposer = (Disposer *)__n;
    this_00[1].dependency.ptr = pPVar4;
    this_00[1].continuationTracePtr = __buf;
    local_50.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo::write(void_const*,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    local_50.ptr = (PromiseNode *)this_00;
    OVar5 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_40,&local_50);
    pPVar4 = local_50.ptr;
    local_60.super_PromiseBase.node.disposer._0_4_ = local_40.exception._0_4_;
    local_60.super_PromiseBase.node.disposer._4_4_ = local_40.exception._4_4_;
    local_60.super_PromiseBase.node.ptr = uStack_38;
    if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
      local_50.ptr = (PromiseNode *)0x0;
      (**(local_50.disposer)->_vptr_Disposer)
                (local_50.disposer,
                 ((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode,OVar5.ptr);
    }
    OVar6 = heap<kj::_::AdapterPromiseNode<kj::_::Void,kj::Canceler::AdapterImpl<void>>,kj::Canceler&,kj::Promise<void>>
                      ((kj *)&local_40,(Canceler *)(pp_Var3 + 7),&local_60);
    pPVar4 = local_60.super_PromiseBase.node.ptr;
    uVar1 = (undefined4)uStack_38;
    uVar2 = uStack_38._4_4_;
    uStack_38 = (PromiseNode *)0x0;
    *(undefined4 *)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         local_40.exception._0_4_;
    *(undefined4 *)
     ((long)&(this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream + 4) =
         local_40.exception._4_4_;
    *(undefined4 *)&(this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         uVar1;
    *(undefined4 *)
     ((long)&(this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream + 4) =
         uVar2;
    if (local_60.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_60.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_60.super_PromiseBase.node.disposer._4_4_,
                           local_60.super_PromiseBase.node.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(local_60.super_PromiseBase.node.disposer._4_4_,
                          local_60.super_PromiseBase.node.disposer._0_4_),
                 pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode,OVar6.ptr);
    }
    pPVar4 = local_70.ptr;
    if (local_70.ptr != (PromiseNode *)0x0) {
      local_70.ptr = (PromiseNode *)0x0;
      (**(local_70.disposer)->_vptr_Disposer)
                (local_70.disposer,pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode)
      ;
    }
    return (ssize_t)this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x326,FAILED,"canceler.isEmpty()","\"already pumping\"",
             (char (*) [16])"already pumping");
  _::Debug::Fault::fatal(&local_40);
}

Assistant:

KJ_IF_MAYBE(reason, stoppage) {
        if (reason->is<Eof>()) {
          return uint64_t(0);
        }
        return cp(reason->get<Exception>());
      }